

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.cpp
# Opt level: O0

void duckdb::ColumnReader::ApplyFilter
               (Vector *v,TableFilter *filter,TableFilterState *filter_state,idx_t scan_count,
               SelectionVector *sel,idx_t *approved_tuple_count)

{
  UnifiedVectorFormat vdata;
  idx_t in_stack_000003f0;
  TableFilterState *in_stack_000003f8;
  TableFilter *in_stack_00000400;
  UnifiedVectorFormat *in_stack_00000408;
  Vector *in_stack_00000410;
  SelectionVector *in_stack_00000418;
  idx_t *in_stack_00000430;
  UnifiedVectorFormat *this;
  UnifiedVectorFormat *in_stack_ffffffffffffff80;
  UnifiedVectorFormat local_78;
  
  this = &local_78;
  UnifiedVectorFormat::UnifiedVectorFormat(in_stack_ffffffffffffff80);
  Vector::ToUnifiedFormat
            ((Vector *)
             vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi,
             (idx_t)vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                    .
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr,
             (UnifiedVectorFormat *)
             vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask);
  ColumnSegment::FilterSelection
            (in_stack_00000418,in_stack_00000410,in_stack_00000408,in_stack_00000400,
             in_stack_000003f8,in_stack_000003f0,in_stack_00000430);
  UnifiedVectorFormat::~UnifiedVectorFormat(this);
  return;
}

Assistant:

void ColumnReader::ApplyFilter(Vector &v, const TableFilter &filter, TableFilterState &filter_state, idx_t scan_count,
                               SelectionVector &sel, idx_t &approved_tuple_count) {
	UnifiedVectorFormat vdata;
	v.ToUnifiedFormat(scan_count, vdata);
	ColumnSegment::FilterSelection(sel, v, vdata, filter, filter_state, scan_count, approved_tuple_count);
}